

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O0

void __thiscall
QPlainTextEditPrivate::append(QPlainTextEditPrivate *this,QString *text,TextFormat format)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  QTextDocument *pQVar6;
  QPlainTextDocumentLayoutPrivate *pQVar7;
  int in_EDX;
  QPlainTextEditPrivate *in_RSI;
  QPlainTextEditPrivate *in_RDI;
  long in_FS_OFFSET;
  bool bVar8;
  qreal qVar9;
  qreal qVar10;
  bool needScroll;
  bool updatesBlocked;
  bool blockUpdate;
  bool documentSizeChangedBlocked;
  bool atBottom;
  int maximumBlockCount;
  QPlainTextDocumentLayout *documentLayout;
  QTextDocument *document;
  QPlainTextEdit *q;
  QTextCursor cursor;
  QRect *in_stack_fffffffffffffeb8;
  QPlainTextEditPrivate *in_stack_fffffffffffffec0;
  undefined8 in_stack_fffffffffffffec8;
  int _t2;
  QPlainTextEditControl *pQVar11;
  undefined8 in_stack_fffffffffffffed0;
  int value;
  QWidget *in_stack_fffffffffffffed8;
  QRectF local_90;
  undefined1 *local_70;
  QRect local_68;
  QRect local_58;
  QRectF local_48;
  undefined1 local_28 [16];
  undefined1 local_18 [16];
  long local_8;
  
  value = (int)((ulong)in_stack_fffffffffffffed0 >> 0x20);
  _t2 = (int)((ulong)in_stack_fffffffffffffec8 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  q_func(in_RDI);
  pQVar6 = QWidgetTextControl::document((QWidgetTextControl *)in_stack_fffffffffffffec0);
  QTextDocument::documentLayout();
  qobject_cast<QPlainTextDocumentLayout*>((QObject *)0x6c8dfe);
  iVar4 = QTextDocument::maximumBlockCount();
  if (iVar4 != 0) {
    QTextDocument::setMaximumBlockCount((int)pQVar6);
  }
  bVar3 = QWidget::isVisible((QWidget *)0x6c8e37);
  bVar2 = false;
  if (bVar3) {
    pQVar11 = in_RDI->control;
    QTextDocument::lastBlock();
    (**(code **)(*(long *)&pQVar11->super_QWidgetTextControl + 0x80))(&local_48,pQVar11,local_18);
    qVar9 = QRectF::bottom(&local_48);
    qVar10 = verticalOffset(in_stack_fffffffffffffec0);
    local_58 = QWidget::rect(in_stack_fffffffffffffed8);
    iVar5 = QRect::bottom((QRect *)0x6c8eeb);
    bVar2 = qVar9 - qVar10 <= (double)iVar5;
  }
  bVar3 = QWidget::isVisible((QWidget *)0x6c8f17);
  if (!bVar3) {
    in_RDI->field_0x348 = in_RDI->field_0x348 & 0xfd | 2;
  }
  pQVar7 = QPlainTextDocumentLayout::priv((QPlainTextDocumentLayout *)in_stack_fffffffffffffec0);
  bVar3 = pQVar7->blockDocumentSizeChanged;
  pQVar7 = QPlainTextDocumentLayout::priv((QPlainTextDocumentLayout *)in_stack_fffffffffffffec0);
  pQVar7->blockDocumentSizeChanged = true;
  if (in_EDX == 0) {
    QWidgetTextControl::appendPlainText
              ((QWidgetTextControl *)in_stack_fffffffffffffec0,(QString *)in_stack_fffffffffffffeb8)
    ;
  }
  else if (in_EDX == 1) {
    QWidgetTextControl::appendHtml
              ((QWidgetTextControl *)in_stack_fffffffffffffec0,(QString *)in_stack_fffffffffffffeb8)
    ;
  }
  else {
    QWidgetTextControl::append
              ((QWidgetTextControl *)in_stack_fffffffffffffec0,(QString *)in_stack_fffffffffffffeb8)
    ;
  }
  if (0 < iVar4) {
    iVar5 = QTextDocument::blockCount();
    if (iVar4 < iVar5) {
      bVar8 = in_RDI->control->topBlock != 0;
      if (bVar8) {
        in_RDI->control->topBlock = in_RDI->control->topBlock + -1;
        local_68 = QWidget::rect(in_stack_fffffffffffffed8);
        QPlainTextEdit::updateRequest
                  ((QPlainTextEdit *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,_t2);
      }
      pQVar7 = QPlainTextDocumentLayout::priv((QPlainTextDocumentLayout *)in_stack_fffffffffffffec0)
      ;
      bVar1 = pQVar7->blockUpdate;
      pQVar7 = QPlainTextDocumentLayout::priv((QPlainTextDocumentLayout *)in_stack_fffffffffffffec0)
      ;
      pQVar7->blockUpdate = bVar8;
      local_70 = &DAT_aaaaaaaaaaaaaaaa;
      QTextCursor::QTextCursor((QTextCursor *)&local_70,pQVar6);
      QTextCursor::movePosition((MoveOperation)&local_70,0x10,1);
      QTextCursor::removeSelectedText();
      pQVar7 = QPlainTextDocumentLayout::priv((QPlainTextDocumentLayout *)in_stack_fffffffffffffec0)
      ;
      pQVar7->blockUpdate = (bool)(bVar1 & 1);
      QTextCursor::~QTextCursor((QTextCursor *)&local_70);
    }
    QTextDocument::setMaximumBlockCount((int)pQVar6);
  }
  pQVar7 = QPlainTextDocumentLayout::priv((QPlainTextDocumentLayout *)in_stack_fffffffffffffec0);
  pQVar7->blockDocumentSizeChanged = (bool)(bVar3 & 1);
  adjustScrollbars(in_RSI);
  if (bVar2) {
    bVar2 = true;
    if (((byte)in_RDI->field_0x348 >> 3 & 1) != 0) {
      pQVar11 = in_RDI->control;
      QTextDocument::lastBlock();
      (**(code **)(*(long *)&pQVar11->super_QWidgetTextControl + 0x80))(&local_90,pQVar11,local_28);
      qVar9 = QRectF::bottom(&local_90);
      qVar10 = verticalOffset(in_stack_fffffffffffffec0);
      in_stack_fffffffffffffed8 = (QWidget *)(qVar9 - qVar10);
      QWidget::rect(in_stack_fffffffffffffed8);
      value = (int)((ulong)qVar9 >> 0x20);
      iVar4 = QRect::bottom((QRect *)0x6c9208);
      bVar2 = (double)iVar4 < (double)in_stack_fffffffffffffed8;
    }
    if (bVar2) {
      QAbstractSlider::maximum
                (&((in_RDI->super_QAbstractScrollAreaPrivate).vbar)->super_QAbstractSlider);
      QAbstractSlider::setValue((QAbstractSlider *)in_stack_fffffffffffffed8,value);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QPlainTextEditPrivate::append(const QString &text, Qt::TextFormat format)
{
    Q_Q(QPlainTextEdit);

    QTextDocument *document = control->document();
    QPlainTextDocumentLayout *documentLayout = qobject_cast<QPlainTextDocumentLayout*>(document->documentLayout());
    Q_ASSERT(documentLayout);

    int maximumBlockCount = document->maximumBlockCount();
    if (maximumBlockCount)
        document->setMaximumBlockCount(0);

    const bool atBottom =  q->isVisible()
                           && (control->blockBoundingRect(document->lastBlock()).bottom() - verticalOffset()
                               <= viewport->rect().bottom());

    if (!q->isVisible())
        showCursorOnInitialShow = true;

    bool documentSizeChangedBlocked = documentLayout->priv()->blockDocumentSizeChanged;
    documentLayout->priv()->blockDocumentSizeChanged = true;

    switch (format) {
    case Qt::RichText:
        control->appendHtml(text);
        break;
    case Qt::PlainText:
        control->appendPlainText(text);
        break;
    default:
        control->append(text);
        break;
    }

    if (maximumBlockCount > 0) {
        if (document->blockCount() > maximumBlockCount) {
            bool blockUpdate = false;
            if (control->topBlock) {
                control->topBlock--;
                blockUpdate = true;
                emit q->updateRequest(viewport->rect(), 0);
            }

            bool updatesBlocked = documentLayout->priv()->blockUpdate;
            documentLayout->priv()->blockUpdate = blockUpdate;
            QTextCursor cursor(document);
            cursor.movePosition(QTextCursor::NextBlock, QTextCursor::KeepAnchor);
            cursor.removeSelectedText();
            documentLayout->priv()->blockUpdate = updatesBlocked;
        }
        document->setMaximumBlockCount(maximumBlockCount);
    }

    documentLayout->priv()->blockDocumentSizeChanged = documentSizeChangedBlocked;
    adjustScrollbars();


    if (atBottom) {
        const bool needScroll =  !centerOnScroll
                                 || control->blockBoundingRect(document->lastBlock()).bottom() - verticalOffset()
                                 > viewport->rect().bottom();
        if (needScroll)
            vbar->setValue(vbar->maximum());
    }
}